

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  uint uVar1;
  FILE *__stream;
  size_t __size;
  uchar *__ptr;
  size_t sVar2;
  
  *out = (uchar *)0x0;
  *outsize = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0x4e;
  }
  else {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    rewind(__stream);
    *outsize = 0;
    __ptr = (uchar *)malloc(__size);
    *out = __ptr;
    if (__ptr != (uchar *)0x0 && __size != 0) {
      sVar2 = fread(__ptr,1,__size,__stream);
      *outsize = sVar2;
    }
    fclose(__stream);
    uVar1 = 0x53;
    if (*out != (uchar *)0x0) {
      uVar1 = 0;
    }
    if (__size == 0) {
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename)
{
  FILE* file;
  long size;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;

  file = fopen(filename, "rb");
  if(!file) return 78;

  /*get filesize:*/
  fseek(file , 0 , SEEK_END);
  size = ftell(file);
  rewind(file);

  /*read contents of the file into the vector*/
  *outsize = 0;
  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(size && (*out)) (*outsize) = fread(*out, 1, (size_t)size, file);

  fclose(file);
  if(!(*out) && size) return 83; /*the above malloc failed*/
  return 0;
}